

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
rc::gen::container<std::__cxx11::string,char>
          (Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,gen *this,Gen<char> *gens)

{
  anon_class_48_2_4a94e98e local_50;
  GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  local_1a;
  ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
  local_19;
  gen *pgStack_18;
  ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
  helper;
  Gen<char> *gens_local;
  
  pgStack_18 = this;
  detail::
  ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
  ::ContainerHelper(&local_19,&local_1a);
  local_50._0_1_ = local_19;
  Gen<char>::Gen(&local_50.gens,(Gen<char> *)this);
  Gen<std::__cxx11::string>::
  Gen<rc::gen::container<std::__cxx11::string,char>(rc::Gen<char>)::_lambda(rc::Random_const&,int)_1_,void>
            ((Gen<std::__cxx11::string> *)__return_storage_ptr__,&local_50);
  container<std::__cxx11::string,char>(rc::Gen<char>)::{lambda(rc::Random_const&,int)#1}::~Random
            ((_lambda_rc__Random_const__int__1_ *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

Gen<Container> container(Gen<Ts>... gens) {
  using Strategy = detail::GenericContainerStrategy<Container>;
  detail::ContainerHelper<Container, Strategy> helper{Strategy()};

  return [=](const Random &random, int size) {
    return helper.generate(random, size, gens...);
  };
}